

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kmip.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Kmip::writeRole
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Kmip *this,Path *scope,Path *role,Parameters *parameters)

{
  Client *client;
  string local_d0;
  Path local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Url local_70;
  string local_50;
  
  client = *(Client **)this;
  Vault::operator+(&local_50,"scope/",scope);
  std::operator+(&local_90,&local_50,"/role/");
  Vault::operator+(&local_d0,&local_90,role);
  local_b0.value_._M_dataplus._M_p = (pointer)&local_b0.value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
    local_b0.value_.field_2._8_8_ = local_d0.field_2._8_8_;
  }
  else {
    local_b0.value_._M_dataplus._M_p = local_d0._M_dataplus._M_p;
  }
  local_b0.value_._M_string_length = local_d0._M_string_length;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  getUrl(&local_70,this,&local_b0);
  HttpConsumer::post(__return_storage_ptr__,client,&local_70,parameters);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Kmip::writeRole(const Path &scope, const Path &role,
                       const Parameters &parameters) {
  return HttpConsumer::post(
      client_, getUrl(Path{"scope/" + scope + "/role/" + role}), parameters);
}